

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

Time __thiscall helics::InputInfo::nextValueTime(InputInfo *this)

{
  pointer pdVar1;
  long lVar2;
  Time TVar3;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *q;
  pointer pvVar4;
  
  TVar3.internalTimeCode = 0x7fffffffffffffff;
  if (this->not_interruptible == false) {
    for (pvVar4 = (this->data_queues).
                  super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 != (this->data_queues).
                  super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar4 = pvVar4 + 1) {
      pdVar1 = (pvVar4->
               super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pdVar1 != (pvVar4->
                     super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                     )._M_impl.super__Vector_impl_data._M_finish) &&
         (lVar2 = (pdVar1->time).internalTimeCode, lVar2 < TVar3.internalTimeCode)) {
        TVar3.internalTimeCode = lVar2;
      }
    }
  }
  return (Time)TVar3.internalTimeCode;
}

Assistant:

Time InputInfo::nextValueTime() const
{
    Time nvtime = Time::maxVal();
    if (not_interruptible) {
        return nvtime;
    }
    for (const auto& q : data_queues) {
        if (!q.empty()) {
            if (q.front().time < nvtime) {
                nvtime = q.front().time;
            }
        }
    }
    return nvtime;
}